

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

void VW_SaveModel(VW_HANDLE handle)

{
  ulong uVar1;
  long in_RDI;
  string name;
  vw *pointer;
  string local_58 [32];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  vw *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,(string *)(in_RDI + 0x3570));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_58,(string *)&stack0xffffffffffffffd0);
    VW::save_predictor(in_stack_ffffffffffffffd0,
                       (string *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_SaveModel(VW_HANDLE handle)
{ vw* pointer = static_cast<vw*>(handle);

  string name = pointer->final_regressor_name;
  if (name.empty())
  { return;
  }

  return VW::save_predictor(*pointer, name);
}